

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match64_inc.h
# Opt level: O0

void InitializeH6(HasherHandle handle,BrotliEncoderParams *params)

{
  H6 *self;
  HasherCommon *common;
  BrotliEncoderParams *params_local;
  HasherHandle handle_local;
  
  *(int *)(handle + 0x38) = 0x40 - *(int *)(handle + 4);
  *(ulong *)(handle + 0x40) =
       0xffffffffffffffff >> (0x40U - (char)(*(int *)(handle + 0xc) << 3) & 0x3f);
  *(long *)(handle + 0x28) = 1L << ((byte)*(undefined4 *)(handle + 4) & 0x3f);
  *(long *)(handle + 0x30) = 1L << ((byte)*(undefined4 *)(handle + 8) & 0x3f);
  *(int *)(handle + 0x48) = (int)*(undefined8 *)(handle + 0x30) + -1;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherHandle handle, const BrotliEncoderParams* params) {
  HasherCommon* common = GetHasherCommon(handle);
  HashLongestMatch* self = FN(Self)(handle);
  BROTLI_UNUSED(params);
  self->hash_shift_ = 64 - common->params.bucket_bits;
  self->hash_mask_ = (~((uint64_t)0U)) >> (64 - 8 * common->params.hash_len);
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
}